

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O1

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,double Val)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  _func_int **pp_Var3;
  long lVar4;
  double *pdVar5;
  double tmp;
  undefined8 local_18;
  double local_10;
  
  pdVar5 = (double *)&local_18;
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    puVar2 = (undefined1 *)((long)&local_18 + 7);
    local_18 = Val;
    lVar4 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&local_18 + lVar4);
      *(undefined1 *)((long)&local_18 + lVar4) = *puVar2;
      *puVar2 = uVar1;
      lVar4 = lVar4 + 1;
      puVar2 = puVar2 + -1;
    } while (lVar4 != 4);
    pp_Var3 = (this->super_ChStreamOut)._vptr_ChStreamOut;
  }
  else {
    pp_Var3 = (this->super_ChStreamOut)._vptr_ChStreamOut;
    pdVar5 = &local_10;
  }
  local_10 = Val;
  (*pp_Var3[2])(this,pdVar5,8);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(const double Val) {
    if (big_endian_machine) {
        double tmp = Val;
        StreamSwapBytes<double>(&tmp);
        this->Output((char*)&tmp, sizeof(double));
    } else {
        this->Output((char*)&Val, sizeof(double));
    }
    return (*this);
}